

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O0

void __thiscall
Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::integrity
          (Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *this)

{
  Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *this_local;
  
  return;
}

Assistant:

void Polynom<Number>::integrity() const {
#if VDEBUG
  ASS(_summands.size() > 0)
  for (auto const& x : _summands)
    x.integrity();
  if (_summands.size() > 0) {
    auto iter = this->_summands.begin();
    auto last = iter++;
    while (iter != _summands.end()) {
      ASS_REP(last->factors <= iter->factors, *this);
      last = iter++;
    }
  } 
#endif
}